

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Guard.h
# Opt level: O3

void __thiscall Guard::Guard(Guard *this,function<void_()> *enter,function<void_()> *leave)

{
  std::function<void_()>::function(&this->leave_,leave);
  if ((enter->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*enter->_M_invoker)((_Any_data *)enter);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

Guard(const std::function<void ()> &enter,
          const std::function<void ()> &leave)
    : leave_(leave)
    {
        enter();
    }